

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::ZSTDCompressionState::GetExtraPageBuffer
          (ZSTDCompressionState *this,block_id_t current_block_id)

{
  BufferManager *pBVar1;
  bool bVar2;
  BlockManager *pBVar3;
  BufferHandle *pBVar4;
  optional_ptr<duckdb::BufferHandle,_true> local_40;
  BufferHandle local_38;
  
  pBVar3 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  pBVar1 = pBVar3->buffer_manager;
  pBVar4 = (this->current_buffer).ptr;
  if (this->in_vector == true) {
    if (pBVar4 == (this->vector_lengths_buffer).ptr) {
      local_40.ptr = this->extra_pages + 1;
      if (pBVar4 != this->extra_pages) {
        local_40.ptr = this->extra_pages;
      }
      goto LAB_014d2209;
    }
  }
  else if (pBVar4 == &this->segment_handle) {
    local_40.ptr = this->extra_pages;
    goto LAB_014d2209;
  }
  pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator*(&this->current_buffer);
  FlushPage(this,pBVar4,current_block_id);
  local_40.ptr = (this->current_buffer).ptr;
LAB_014d2209:
  pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator->(&local_40);
  bVar2 = BufferHandle::IsValid(pBVar4);
  if (!bVar2) {
    (*pBVar1->_vptr_BufferManager[5])(&local_38,pBVar1,8,pBVar3,1);
    pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator*(&local_40);
    BufferHandle::operator=(pBVar4,&local_38);
    BufferHandle::~BufferHandle(&local_38);
  }
  pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator*(&local_40);
  return pBVar4;
}

Assistant:

BufferHandle &GetExtraPageBuffer(block_id_t current_block_id) {
		auto &block_manager = partial_block_manager.GetBlockManager();
		auto &buffer_manager = block_manager.buffer_manager;

		optional_ptr<BufferHandle> to_use;

		if (in_vector) {
			// Currently in a Vector, we have to be mindful of the buffer that the string_lengths lives on
			// as that will have to stay writable until the Vector is finished
			bool already_separated = current_buffer != vector_lengths_buffer;
			if (already_separated) {
				// Already separated, can keep using the other buffer (flush it first)
				FlushPage(*current_buffer, current_block_id);
				to_use = current_buffer;
			} else {
				// Not already separated, have to use the other page
				to_use = current_buffer == &extra_pages[0] ? &extra_pages[1] : &extra_pages[0];
			}
		} else {
			// Start of a new Vector, the string_lengths did not fit on the previous page
			bool previous_page_is_segment = current_buffer == &segment_handle;
			if (!previous_page_is_segment) {
				// We're asking for a fresh buffer to start the vectors data
				// that means the previous vector is finished - so we can flush the current page and reuse it
				D_ASSERT(current_block_id != INVALID_BLOCK);
				FlushPage(*current_buffer, current_block_id);
				to_use = current_buffer;
			} else {
				// Previous buffer was the segment, take the first extra page in this case
				to_use = &extra_pages[0];
			}
		}

		if (!to_use->IsValid()) {
			*to_use = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, &block_manager);
		}
		return *to_use;
	}